

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_solver.cpp
# Opt level: O0

void __thiscall
WorldSolver::setup(WorldSolver *this,WorldNode *start_node,WorldNode *end_node,
                  vector<Item_*,_std::allocator<Item_*>_> *starting_inventory)

{
  initializer_list<WorldNode_*> __l;
  WorldNode *local_40;
  iterator local_38;
  undefined8 local_30;
  vector<Item_*,_std::allocator<Item_*>_> *local_28;
  vector<Item_*,_std::allocator<Item_*>_> *starting_inventory_local;
  WorldNode *end_node_local;
  WorldNode *start_node_local;
  WorldSolver *this_local;
  
  this->_start_node = start_node;
  this->_end_node = end_node;
  local_40 = this->_start_node;
  local_38 = &local_40;
  local_30 = 1;
  __l._M_len = 1;
  __l._M_array = local_38;
  local_28 = starting_inventory;
  starting_inventory_local = (vector<Item_*,_std::allocator<Item_*>_> *)end_node;
  end_node_local = start_node;
  start_node_local = (WorldNode *)this;
  std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::operator=(&this->_nodes_to_explore,__l);
  std::vector<Item_*,_std::allocator<Item_*>_>::operator=(&this->_starting_inventory,local_28);
  std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::clear(&this->_explored_nodes);
  std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::clear(&this->_blocked_paths);
  std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::clear(&this->_reachable_item_sources);
  std::vector<Item_*,_std::allocator<Item_*>_>::clear(&this->_relevant_items);
  std::vector<Item_*,_std::allocator<Item_*>_>::clear(&this->_inventory);
  this->_step_count = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::clear(&this->_debug_log);
  return;
}

Assistant:

void WorldSolver::setup(WorldNode* start_node, WorldNode* end_node, const std::vector<Item*>& starting_inventory)
{
    _start_node = start_node;
    _end_node = end_node;
    _nodes_to_explore = { _start_node };
    _starting_inventory = starting_inventory;

    _explored_nodes.clear();
    _blocked_paths.clear();
    _reachable_item_sources.clear();
    _relevant_items.clear();
    _inventory.clear();
    _step_count = 0;
    
    _debug_log.clear();
}